

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O0

void __thiscall
QtMWidgets::PageControlPrivate::PageControlPrivate(PageControlPrivate *this,PageControl *parent)

{
  PageControl *parent_local;
  PageControlPrivate *this_local;
  
  this->q = parent;
  this->count = 0;
  this->currentIndex = -1;
  QColor::QColor(&this->pageIndicatorColor);
  QColor::QColor(&this->currentPageIndicatorColor);
  this->radius = 0;
  this->smallRadius = 0;
  this->buttonSize = 0;
  this->linesCount = 0;
  this->countInOneLine = 0;
  this->countInLastLine = 0;
  this->widgetWidth = 0;
  QList<QRect>::QList(&this->rectangles);
  QPoint::QPoint(&this->clickPos);
  this->leftButtonPressed = false;
  init(this,(EVP_PKEY_CTX *)parent);
  return;
}

Assistant:

PageControlPrivate( PageControl * parent )
		:	q( parent )
		,	count( 0 )
		,	currentIndex( -1 )
		,	radius( 0 )
		,	smallRadius( 0 )
		,	buttonSize( 0 )
		,	linesCount( 0 )
		,	countInOneLine( 0 )
		,	countInLastLine( 0 )
		,	widgetWidth( 0 )
		,	leftButtonPressed( false )
	{
		init();
	}